

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchText(int oldSize)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  spritedef_t *__dest;
  DEHSprName *pDVar5;
  char *name;
  char *str;
  uint ii;
  int i;
  int result;
  INTBOOL good;
  char *temp;
  char *newStr;
  char *oldStr;
  int local_10;
  int newSize;
  int oldSize_local;
  
  for (_result = Line2; ' ' < *_result; _result = _result + 1) {
  }
  while( true ) {
    bVar1 = false;
    if (*_result != '\0') {
      bVar1 = *_result < '!';
    }
    if (!bVar1) break;
    _result = _result + 1;
  }
  local_10 = oldSize;
  if (*_result == '\0') {
    Printf("Text chunk is missing size of new string.\n");
    newSize = 2;
  }
  else {
    oldStr._4_4_ = atoi(_result);
    newStr = (char *)operator_new__((long)(local_10 + 1));
    temp = (char *)operator_new__((long)(oldStr._4_4_ + 1));
    if ((newStr == (char *)0x0) || (temp == (char *)0x0)) {
      Printf("Out of memory.\n");
    }
    else {
      bVar1 = ReadChars(&newStr,local_10);
      bVar2 = ReadChars(&temp,oldStr._4_4_);
      if ((char)(bVar2 + bVar1) == '\0') {
        if (temp != (char *)0x0) {
          operator_delete__(temp);
        }
        if (newStr != (char *)0x0) {
          operator_delete__(newStr);
        }
        Printf("Unexpected end-of-file.\n");
        return 0;
      }
      if ((includenotext & 1U) == 0) {
        DPrintf(4,"Searching for text:\n%s\n",newStr);
        bVar1 = false;
        if ((local_10 == 4) && (iVar3 = FindSprite(newStr), iVar3 != -1)) {
          __dest = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)iVar3);
          strncpy((char *)__dest,temp,4);
          iVar3 = strncmp("PLAY",newStr,4);
          if (iVar3 == 0) {
            strncpy(deh.PlayerSprite,temp,4);
          }
          for (str._0_4_ = 0; uVar4 = TArray<DEHSprName,_DEHSprName>::Size(&OrgSprNames),
              (uint)str < uVar4; str._0_4_ = (uint)str + 1) {
            pDVar5 = TArray<DEHSprName,_DEHSprName>::operator[](&OrgSprNames,(ulong)(uint)str);
            iVar3 = strcasecmp(pDVar5->c,newStr);
            if (iVar3 == 0) {
              pDVar5 = TArray<DEHSprName,_DEHSprName>::operator[](&OrgSprNames,(ulong)(uint)str);
              strcpy(pDVar5->c,temp);
            }
          }
          str._4_4_ = 0;
LAB_0045d9da:
          if (str._4_4_ < 0x24) {
            iVar3 = strncmp(DehSpriteMappings[(int)str._4_4_].Sprite,newStr,4);
            if (iVar3 != 0) goto LAB_0045db2d;
            strncpy(DehSpriteMappings[(int)str._4_4_].Sprite,temp,4);
            while( true ) {
              bVar1 = false;
              if (0 < (int)str._4_4_) {
                iVar3 = strncmp(DehSpriteMappings[(int)(str._4_4_ - 1)].Sprite,temp,4);
                bVar1 = 0 < iVar3;
              }
              if (!bVar1) break;
              swapvalues<DehSpriteMap>
                        (DehSpriteMappings + (int)(str._4_4_ - 1),DehSpriteMappings + (int)str._4_4_
                        );
              str._4_4_ = str._4_4_ - 1;
            }
            while( true ) {
              bVar1 = false;
              if (str._4_4_ < 0x23) {
                iVar3 = strncmp(DehSpriteMappings[(int)(str._4_4_ + 1)].Sprite,temp,4);
                bVar1 = iVar3 < 0;
              }
              if (!bVar1) break;
              swapvalues<DehSpriteMap>
                        (DehSpriteMappings + (int)(str._4_4_ + 1),DehSpriteMappings + (int)str._4_4_
                        );
              str._4_4_ = str._4_4_ + 1;
            }
          }
          goto LAB_0045dbb2;
        }
        while (name = FStringTable::MatchString(EnglishStrings,newStr), name != (char *)0x0) {
          FStringTable::SetString(&GStrings,name,temp);
          FStringTable::SetString(EnglishStrings,name,"~~");
          bVar1 = true;
        }
        if (!bVar1) {
          DPrintf(4,"   (Unmatched)\n");
        }
      }
      else {
        Printf("Skipping text chunk in included patch.\n");
      }
    }
LAB_0045dbb2:
    if ((temp != (char *)0x0) && (temp != (char *)0x0)) {
      operator_delete__(temp);
    }
    if ((newStr != (char *)0x0) && (newStr != (char *)0x0)) {
      operator_delete__(newStr);
    }
    do {
      newSize = GetLine();
    } while (newSize == 1);
  }
  return newSize;
LAB_0045db2d:
  str._4_4_ = str._4_4_ + 1;
  goto LAB_0045d9da;
}

Assistant:

static int PatchText (int oldSize)
{
	int newSize;
	char *oldStr;
	char *newStr;
	char *temp;
	INTBOOL good;
	int result;
	int i;

	// Skip old size, since we already know it
	temp = Line2;
	while (*temp > ' ')
		temp++;
	while (*temp && *temp <= ' ')
		temp++;

	if (*temp == 0)
	{
		Printf ("Text chunk is missing size of new string.\n");
		return 2;
	}
	newSize = atoi (temp);

	oldStr = new char[oldSize + 1];
	newStr = new char[newSize + 1];

	if (!oldStr || !newStr)
	{
		Printf ("Out of memory.\n");
		goto donewithtext;
	}

	good = ReadChars (&oldStr, oldSize);
	good += ReadChars (&newStr, newSize);

	if (!good)
	{
		delete[] newStr;
		delete[] oldStr;
		Printf ("Unexpected end-of-file.\n");
		return 0;
	}

	if (includenotext)
	{
		Printf ("Skipping text chunk in included patch.\n");
		goto donewithtext;
	}

	DPrintf (DMSG_SPAMMY, "Searching for text:\n%s\n", oldStr);
	good = false;

	// Search through sprite names; they are always 4 chars
	if (oldSize == 4)
	{
		i = FindSprite (oldStr);
		if (i != -1)
		{
			strncpy (sprites[i].name, newStr, 4);
			if (strncmp ("PLAY", oldStr, 4) == 0)
			{
				strncpy (deh.PlayerSprite, newStr, 4);
			}
			for (unsigned ii = 0; ii < OrgSprNames.Size(); ii++)
			{
				if (!stricmp(OrgSprNames[ii].c, oldStr))
				{
					strcpy(OrgSprNames[ii].c, newStr);
				}
			}
			// If this sprite is used by a pickup, then the DehackedPickup sprite map
			// needs to be updated too.
			for (i = 0; (size_t)i < countof(DehSpriteMappings); ++i)
			{
				if (strncmp (DehSpriteMappings[i].Sprite, oldStr, 4) == 0)
				{
					// Found a match, so change it.
					strncpy (DehSpriteMappings[i].Sprite, newStr, 4);

					// Now shift the map's entries around so that it stays sorted.
					// This must be done because the map is scanned using a binary search.
					while (i > 0 && strncmp (DehSpriteMappings[i-1].Sprite, newStr, 4) > 0)
					{
						swapvalues (DehSpriteMappings[i-1], DehSpriteMappings[i]);
						--i;
					}
					while ((size_t)i < countof(DehSpriteMappings)-1 &&
						strncmp (DehSpriteMappings[i+1].Sprite, newStr, 4) < 0)
					{
						swapvalues (DehSpriteMappings[i+1], DehSpriteMappings[i]);
						++i;
					}
					break;
				}
			}
			goto donewithtext;
		}
	}

	// Search through most other texts
	const char *str;
	do
	{
		str = EnglishStrings->MatchString(oldStr);
		if (str != NULL)
		{
			GStrings.SetString(str, newStr);
			EnglishStrings->SetString(str, "~~");	// set to something invalid so that it won't get found again by the next iteration or  by another replacement later
			good = true;
		}
	} 
	while (str != NULL);	// repeat search until the text can no longer be found

	if (!good)
	{
		DPrintf (DMSG_SPAMMY, "   (Unmatched)\n");
	}
		
donewithtext:
	if (newStr)
		delete[] newStr;
	if (oldStr)
		delete[] oldStr;

	// Fetch next identifier for main loop
	while ((result = GetLine ()) == 1)
		;

	return result;
}